

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O0

stop_type_t parse_stop_type(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(value,""), iVar1 == 0)) {
    return ST_REGULAR;
  }
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    return ST_NOT_AVAILABLE;
  }
  iVar1 = strcmp(value,"2");
  if (iVar1 == 0) {
    return ST_CONTACT_AGENCY;
  }
  iVar1 = strcmp(value,"3");
  if (iVar1 == 0) {
    return ST_CONTACT_DRIVER;
  }
  return ST_NOT_SET;
}

Assistant:

stop_type_t parse_stop_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return ST_REGULAR;
    else if (strcmp(value, "1") == 0)
        return ST_NOT_AVAILABLE;
    else if (strcmp(value, "2") == 0)
        return ST_CONTACT_AGENCY;
    else if (strcmp(value, "3") == 0)
        return ST_CONTACT_DRIVER;
    else
        return ST_NOT_SET;
}